

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imap.c
# Opt level: O0

CURLcode imap_setup_connection(connectdata *conn)

{
  Curl_easy *pCVar1;
  CURLcode result;
  Curl_easy *data;
  connectdata *conn_local;
  
  pCVar1 = conn->data;
  conn_local._4_4_ = imap_init(conn);
  if (conn_local._4_4_ == CURLE_OK) {
    conn->tls_upgraded = false;
    (pCVar1->state).path = (pCVar1->state).path + 1;
    conn_local._4_4_ = CURLE_OK;
  }
  return conn_local._4_4_;
}

Assistant:

static CURLcode imap_setup_connection(struct connectdata *conn)
{
  struct Curl_easy *data = conn->data;

  /* Initialise the IMAP layer */
  CURLcode result = imap_init(conn);
  if(result)
    return result;

  /* Clear the TLS upgraded flag */
  conn->tls_upgraded = FALSE;
  data->state.path++;   /* don't include the initial slash */

  return CURLE_OK;
}